

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int lookup(hash_table_t *table,hash_key_t key,hash_entry_t **entry)

{
  hash_hashvalue_t hVar1;
  int iVar2;
  hash_entry_t *phVar3;
  ulong uVar4;
  hash_entry_t *cur;
  hash_hashvalue_t hashval;
  size_t startindex;
  size_t index;
  hash_entry_t **entry_local;
  hash_key_t key_local;
  hash_table_t *table_local;
  
  hVar1 = (*table->hashfunc)(key);
  uVar4 = (ulong)(long)hVar1 % table->table_size;
  startindex = uVar4;
  do {
    phVar3 = table->table + startindex;
    if (((phVar3->status == 2) && (phVar3->hash_value == hVar1)) &&
       (iVar2 = (*table->keycmp)(phVar3->key,key), iVar2 == 0)) {
      *entry = phVar3;
      return 0;
    }
    if (phVar3->status == 0) {
      return -1;
    }
    startindex = startindex + 1;
    if (startindex == table->table_size) {
      startindex = 0;
    }
  } while (startindex != uVar4);
  return -1;
}

Assistant:

static int lookup(hash_table_t *table, hash_key_t key, hash_entry_t **entry) {
  size_t index = 0, startindex = 0;
  hash_hashvalue_t hashval = 0;

  hashval = table->hashfunc(key);
  index = hashval % table->table_size;
  startindex = index;

  for (;;) {
    hash_entry_t *cur = table->table + index;
    if ((cur->status == INUSE) && (cur->hash_value == hashval) &&
        (table->keycmp(cur->key, key) == 0)) {
      *entry = cur;
      return 0;
    }

    if (cur->status == EMPTY) return -1;
    index++;
    if (index == table->table_size) index = 0;  // GCOVR_EXCL_LINE
    if (index == startindex) return -1;         // GCOVR_EXCL_LINE
  }
}